

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O1

void __thiscall skiwi::anon_unknown_23::foreign_call_10::~foreign_call_10(foreign_call_10 *this)

{
  compile_fixture::~compile_fixture(&this->super_compile_fixture);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      external_function ef;
      ef.name = "add-two-integers";
      ef.address = (uint64_t)&add_two_integers;
      ef.return_type = external_function::T_INT64;
      ef.arguments.push_back(external_function::T_INT64);
      ef.arguments.push_back(external_function::T_INT64);
      externals[ef.name] = ef;
      run("(define (add-two-integers a b) (foreign-call add-two-integers a b))");
      TEST_EQ("15", run("(add-two-integers 7 8)"));
      }